

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int32_t get_inter_cost(AV1_COMP *cpi,MACROBLOCKD *xd,uint8_t *src_mb_buffer,int src_stride,
                      TplBuffers *tpl_tmp_buffers,BLOCK_SIZE bsize,TX_SIZE tx_size,int mi_row,
                      int mi_col,int rf_idx,MV *rfidx_mv,int use_pred_sad)

{
  int dst_stride;
  AV1_PRIMARY *pAVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  int16_t *src_diff;
  tran_low_t *coeff;
  FULLPEL_MV FVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint uVar7;
  undefined7 in_register_00000089;
  BitDepthInfo bd_info;
  int dst_stride_00;
  int bh;
  InterPredParams local_108;
  
  local_108.bit_depth = xd->bd;
  uVar7 = (uint)xd->cur_buf->flags >> 3;
  local_108.use_hbd_buf = uVar7 & 1;
  uVar5 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  dst_stride_00 = 4 << (""[uVar5] & 0x1f);
  bd_info = (BitDepthInfo)(CONCAT44(uVar7,local_108.bit_depth) & 0x1ffffffff);
  bh = 4 << (""[uVar5] & 0x1f);
  pAVar1 = cpi->ppi;
  pYVar2 = (pAVar1->tpl_data).src_ref_frame[rf_idx];
  src_diff = tpl_tmp_buffers->src_diff;
  coeff = tpl_tmp_buffers->coeff;
  if ((cpi->sf).tpl_sf.subpel_force_stop == '\x03') {
    dst_stride = (pYVar2->field_4).field_0.y_stride;
    iVar4 = mi_row * dst_stride + mi_col;
    puVar6 = (pYVar2->field_5).buffers[0];
    FVar3 = get_fullmv_from_mv(rfidx_mv);
    if (use_pred_sad != 0) {
      uVar7 = (*pAVar1->fn_ptr[uVar5].sdf)
                        (src_mb_buffer,src_stride,
                         puVar6 + (long)(((int)FVar3 >> 0x10) + FVar3.row * dst_stride) +
                                  (long)(iVar4 * 4),dst_stride);
      return uVar7;
    }
    uVar7 = tpl_get_satd_cost(bd_info,src_diff,dst_stride_00,src_mb_buffer,src_stride,
                              puVar6 + (long)(((int)FVar3 >> 0x10) + FVar3.row * dst_stride) +
                                       (long)(iVar4 * 4),dst_stride,coeff,dst_stride_00,bh,tx_size);
  }
  else {
    puVar6 = (uint8_t *)((ulong)tpl_tmp_buffers->predictor8 >> 1);
    if (local_108.use_hbd_buf == 0) {
      puVar6 = tpl_tmp_buffers->predictor8;
    }
    local_108.ref_frame_buf.buf0 = (pYVar2->field_5).field_0.y_buffer;
    local_108.ref_frame_buf.width = (pYVar2->field_0).field_0.y_width;
    local_108.ref_frame_buf.height = (pYVar2->field_1).field_0.y_height;
    local_108.ref_frame_buf.stride = (pYVar2->field_4).field_0.y_stride;
    local_108.pix_row = mi_row << 2;
    local_108.pix_col = mi_col << 2;
    local_108.subsampling_x = 0;
    local_108.subsampling_y = 0;
    local_108.is_intrabc = 0;
    local_108.mode = TRANSLATION_PRED;
    local_108.comp_mode = UNIFORM_SINGLE;
    local_108.scale_factors = &(pAVar1->tpl_data).sf;
    local_108.top = -0x47000;
    local_108.left = -0x47000;
    local_108.interp_filter_params[1] = av1_interp_filter_params_list;
    local_108.interp_filter_params[0] = av1_interp_filter_params_list;
    if (dst_stride_00 < 5) {
      local_108.interp_filter_params[0] = av1_interp_4tap;
    }
    if (bh < 5) {
      local_108.interp_filter_params[1] = av1_interp_4tap;
    }
    local_108.ref_frame_buf.buf = (uint8_t *)0x0;
    local_108.conv_params.round_0 = 3;
    if (10 < local_108.bit_depth) {
      local_108.conv_params.round_0 = local_108.bit_depth + -7;
    }
    local_108.conv_params.round_1 = 0xb;
    if (10 < local_108.bit_depth) {
      local_108.conv_params.round_1 = 0x15 - local_108.bit_depth;
    }
    local_108.conv_params.do_average = 0;
    local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_108.conv_params.dst_stride = 0;
    local_108.conv_params.plane = 0;
    local_108.conv_params.is_compound = 0;
    local_108.conv_params.use_dist_wtd_comp_avg = 0;
    local_108.block_width = dst_stride_00;
    local_108.block_height = bh;
    av1_enc_build_one_inter_predictor(puVar6,dst_stride_00,rfidx_mv,&local_108);
    if (use_pred_sad == 0) {
      uVar7 = tpl_get_satd_cost(bd_info,src_diff,dst_stride_00,src_mb_buffer,src_stride,puVar6,
                                dst_stride_00,coeff,dst_stride_00,bh,tx_size);
    }
    else {
      uVar7 = (*cpi->ppi->fn_ptr[uVar5].sdf)(src_mb_buffer,src_stride,puVar6,dst_stride_00);
    }
  }
  return uVar7;
}

Assistant:

static inline int32_t get_inter_cost(const AV1_COMP *cpi, MACROBLOCKD *xd,
                                     const uint8_t *src_mb_buffer,
                                     int src_stride,
                                     TplBuffers *tpl_tmp_buffers,
                                     BLOCK_SIZE bsize, TX_SIZE tx_size,
                                     int mi_row, int mi_col, int rf_idx,
                                     MV *rfidx_mv, int use_pred_sad) {
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  TplParams *tpl_data = &cpi->ppi->tpl_data;
  const YV12_BUFFER_CONFIG *const ref_frame_ptr =
      tpl_data->src_ref_frame[rf_idx];
  int16_t *src_diff = tpl_tmp_buffers->src_diff;
  tran_low_t *coeff = tpl_tmp_buffers->coeff;
  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  int32_t inter_cost;

  if (cpi->sf.tpl_sf.subpel_force_stop != FULL_PEL) {
    const int_interpfilters kernel =
        av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
    uint8_t *predictor8 = tpl_tmp_buffers->predictor8;
    uint8_t *predictor =
        is_cur_buf_hbd(xd) ? CONVERT_TO_BYTEPTR(predictor8) : predictor8;
    struct buf_2d ref_buf = { NULL, ref_frame_ptr->y_buffer,
                              ref_frame_ptr->y_width, ref_frame_ptr->y_height,
                              ref_frame_ptr->y_stride };
    InterPredParams inter_pred_params;
    av1_init_inter_params(&inter_pred_params, bw, bh, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &tpl_data->sf, &ref_buf, kernel);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    av1_enc_build_one_inter_predictor(predictor, bw, rfidx_mv,
                                      &inter_pred_params);

    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(src_mb_buffer, src_stride,
                                                    predictor, bw);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            predictor, bw, coeff, bw, bh, tx_size);
    }
  } else {
    int ref_mb_offset =
        mi_row * MI_SIZE * ref_frame_ptr->y_stride + mi_col * MI_SIZE;
    uint8_t *ref_mb = ref_frame_ptr->y_buffer + ref_mb_offset;
    int ref_stride = ref_frame_ptr->y_stride;
    const FULLPEL_MV fullmv = get_fullmv_from_mv(rfidx_mv);
    // Since sub-pel motion search is not performed, use the prediction pixels
    // directly from the reference block ref_mb
    if (use_pred_sad) {
      inter_cost = (int)cpi->ppi->fn_ptr[bsize].sdf(
          src_mb_buffer, src_stride,
          &ref_mb[fullmv.row * ref_stride + fullmv.col], ref_stride);
    } else {
      inter_cost =
          tpl_get_satd_cost(bd_info, src_diff, bw, src_mb_buffer, src_stride,
                            &ref_mb[fullmv.row * ref_stride + fullmv.col],
                            ref_stride, coeff, bw, bh, tx_size);
    }
  }
  return inter_cost;
}